

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unnest_rewriter.cpp
# Opt level: O3

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::UnnestRewriter::Optimize
          (UnnestRewriter *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *op)

{
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var1;
  pointer prVar2;
  bool bVar3;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *in_RDX;
  reference_wrapper<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>
  *candidate;
  pointer prVar4;
  UnnestRewriterPlanUpdater updater;
  vector<std::reference_wrapper<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>,_true>
  candidates;
  UnnestRewriterPlanUpdater local_70;
  vector<std::reference_wrapper<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>,_true>
  local_48;
  
  local_70.super_LogicalOperatorVisitor._vptr_LogicalOperatorVisitor =
       (_func_int **)&PTR__UnnestRewriterPlanUpdater_0244ac70;
  local_70.replace_bindings.
  super_vector<duckdb::ReplaceBinding,_std::allocator<duckdb::ReplaceBinding>_>.
  super__Vector_base<duckdb::ReplaceBinding,_std::allocator<duckdb::ReplaceBinding>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.replace_bindings.
  super_vector<duckdb::ReplaceBinding,_std::allocator<duckdb::ReplaceBinding>_>.
  super__Vector_base<duckdb::ReplaceBinding,_std::allocator<duckdb::ReplaceBinding>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.replace_bindings.
  super_vector<duckdb::ReplaceBinding,_std::allocator<duckdb::ReplaceBinding>_>.
  super__Vector_base<duckdb::ReplaceBinding,_std::allocator<duckdb::ReplaceBinding>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.
  super_vector<std::reference_wrapper<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>,_std::allocator<std::reference_wrapper<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>,_std::allocator<std::reference_wrapper<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.
  super_vector<std::reference_wrapper<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>,_std::allocator<std::reference_wrapper<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>,_std::allocator<std::reference_wrapper<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super_vector<std::reference_wrapper<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>,_std::allocator<std::reference_wrapper<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>,_std::allocator<std::reference_wrapper<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  FindCandidates((UnnestRewriter *)op,in_RDX,&local_48);
  prVar2 = local_48.
           super_vector<std::reference_wrapper<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>,_std::allocator<std::reference_wrapper<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>,_std::allocator<std::reference_wrapper<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_48.
      super_vector<std::reference_wrapper<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>,_std::allocator<std::reference_wrapper<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>,_std::allocator<std::reference_wrapper<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super_vector<std::reference_wrapper<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>,_std::allocator<std::reference_wrapper<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>,_std::allocator<std::reference_wrapper<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    prVar4 = local_48.
             super_vector<std::reference_wrapper<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>,_std::allocator<std::reference_wrapper<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>,_std::allocator<std::reference_wrapper<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      bVar3 = RewriteCandidate((UnnestRewriter *)op,prVar4->_M_data);
      if (bVar3) {
        local_70.overwritten_tbl_idx =
             (idx_t)op[6].
                    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    ._M_t.
                    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
        UpdateBoundUnnestBindings((UnnestRewriter *)op,&local_70,prVar4->_M_data);
        UpdateRHSBindings((UnnestRewriter *)op,in_RDX,prVar4->_M_data,&local_70);
        _Var1._M_head_impl =
             (op->
             super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
             .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
        if (op[1].
            super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
            .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
            _Var1._M_head_impl) {
          op[1].
          super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
          _M_t.
          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = _Var1._M_head_impl
          ;
        }
        ::std::vector<duckdb::LHSBinding,_std::allocator<duckdb::LHSBinding>_>::_M_erase_at_end
                  ((vector<duckdb::LHSBinding,_std::allocator<duckdb::LHSBinding>_> *)(op + 3),
                   (((vector<duckdb::LHSBinding,_std::allocator<duckdb::LHSBinding>_> *)(op + 3))->
                   super__Vector_base<duckdb::LHSBinding,_std::allocator<duckdb::LHSBinding>_>).
                   _M_impl.super__Vector_impl_data._M_start);
      }
      prVar4 = prVar4 + 1;
    } while (prVar4 != prVar2);
  }
  (this->delim_columns).super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
  super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(in_RDX->
                super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                )._M_t.
                super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  (in_RDX->super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
  ._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
  if (local_48.
      super_vector<std::reference_wrapper<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>,_std::allocator<std::reference_wrapper<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>,_std::allocator<std::reference_wrapper<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super_vector<std::reference_wrapper<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>,_std::allocator<std::reference_wrapper<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>_>
                    .
                    super__Vector_base<std::reference_wrapper<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>,_std::allocator<std::reference_wrapper<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_70.replace_bindings.
      super_vector<duckdb::ReplaceBinding,_std::allocator<duckdb::ReplaceBinding>_>.
      super__Vector_base<duckdb::ReplaceBinding,_std::allocator<duckdb::ReplaceBinding>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    local_70.super_LogicalOperatorVisitor._vptr_LogicalOperatorVisitor =
         (_func_int **)&PTR__UnnestRewriterPlanUpdater_0244ac70;
    operator_delete(local_70.replace_bindings.
                    super_vector<duckdb::ReplaceBinding,_std::allocator<duckdb::ReplaceBinding>_>.
                    super__Vector_base<duckdb::ReplaceBinding,_std::allocator<duckdb::ReplaceBinding>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> UnnestRewriter::Optimize(unique_ptr<LogicalOperator> op) {

	UnnestRewriterPlanUpdater updater;
	vector<reference<unique_ptr<LogicalOperator>>> candidates;
	FindCandidates(op, candidates);

	// rewrite the plan and update the bindings
	for (auto &candidate : candidates) {

		// rearrange the logical operators
		if (RewriteCandidate(candidate)) {
			updater.overwritten_tbl_idx = overwritten_tbl_idx;
			// update the bindings of the BOUND_UNNEST expression
			UpdateBoundUnnestBindings(updater, candidate);
			// update the sequence of LOGICAL_PROJECTION(s)
			UpdateRHSBindings(op, candidate, updater);
			// reset
			delim_columns.clear();
			lhs_bindings.clear();
		}
	}

	return op;
}